

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O0

green_future_t green_poller_pop(green_poller_t poller)

{
  int iVar1;
  green_future_t f;
  green_poller_t poller_local;
  
  fprintf(_stderr,"green_poller_pop()\n");
  if (poller == (green_poller_t)0x0) {
    poller_local = (green_poller_t)0x0;
  }
  else {
    green_poller_dump(poller);
    if ((poller->used == 0) || (poller->busy == poller->used)) {
      poller_local = (green_poller_t)0x0;
    }
    else {
      poller_local = (green_poller_t)poller->futures[poller->busy];
      iVar1 = green_poller_rem(poller,(green_future_t)poller_local);
      if (iVar1 != 0) {
        fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","green_poller_rem(poller, f) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
                ,0x220);
        fflush(_stderr);
        abort();
      }
    }
  }
  return (green_future_t)poller_local;
}

Assistant:

green_future_t green_poller_pop(green_poller_t poller)
{
    fprintf(stderr, "green_poller_pop()\n");

    if (poller == NULL) {
        return NULL;
    }
    green_poller_dump(poller);
    if ((poller->used == 0) || (poller->busy == poller->used)) {
        return NULL;
    }
    green_future_t f = poller->futures[poller->busy];
    green_assert(green_poller_rem(poller, f) == 0);
    return f;
}